

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserAdams.cpp
# Opt level: O2

void chrono::utils::parseADMMarker
               (string *ID,
               vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *tokens,ChSystem *sys)

{
  __type_conflict _Var1;
  mapped_type *pmVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  pointer ppVar3;
  int i;
  long lVar4;
  bool bVar5;
  double dVar6;
  allocator local_59;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::adams_marker_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::adams_marker_struct>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::adams_marker_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::adams_marker_struct>_>_>
                         *)markers_map_abi_cxx11_,ID);
  local_58 = tokens;
  for (ppVar3 = (tokens->
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppVar3 != (tokens->
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; ppVar3 = ppVar3 + 1) {
    if (ppVar3->first == 1) {
      std::__cxx11::string::string((string *)&local_50,"PART",&local_59);
      _Var1 = std::operator==(&ppVar3->second,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (_Var1) {
        ppVar3 = ppVar3 + 1;
        std::__cxx11::string::_M_assign((string *)pmVar2);
      }
      std::__cxx11::string::string((string *)&local_50,"QP",&local_59);
      _Var1 = std::operator==(&ppVar3->second,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (_Var1) {
        for (lVar4 = 0; tokens = local_58, lVar4 != 3; lVar4 = lVar4 + 1) {
          dVar6 = std::__cxx11::stod(&ppVar3[1].second,(size_t *)0x0);
          pmVar2->loc[lVar4] = dVar6;
          ppVar3 = ppVar3 + 1;
        }
      }
      std::__cxx11::string::string((string *)&local_50,"REULER",&local_59);
      _Var1 = std::operator==(&ppVar3->second,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (_Var1) {
        ppVar3 = ppVar3 + 1;
        for (lVar4 = 0; __str = &ppVar3->second, lVar4 != 3; lVar4 = lVar4 + 1) {
          dVar6 = std::__cxx11::stod(__str,(size_t *)0x0);
          bVar5 = (__str->_M_dataplus)._M_p[__str->_M_string_length - 1] == 'D';
          ppVar3 = (pointer)(__str + 1);
          pmVar2->rot[lVar4] =
               (double)((ulong)bVar5 * (long)(dVar6 * 0.017453292519943295) +
                       (ulong)!bVar5 * (long)dVar6);
        }
        ppVar3 = (pointer)((long)(__str + -2) + 0x10);
      }
    }
  }
  return;
}

Assistant:

void parseADMMarker(std::string ID, std::vector<std::pair<int, std::string>>& tokens, ChSystem& sys) {
    adams_marker_struct& marker = markers_map[ID];  // uses default contructor
    auto iter = tokens.begin();
    while (iter != tokens.end()) {
        // std::cout << "token is " << iter->first << ", " << iter->second <<std::endl;
        if (iter->first == LABEL) {
            if (iter->second == std::string("PART")) {
                iter++;
                marker.part_id = iter->second;
            }
            if (iter->second == std::string("QP")) {
                // std::cout << "reading loc " <<std::endl;

                for (int i = 0; i < 3; i++) {
                    iter++;
                    // std::cout << "token is " << iter->first << ", " << iter->second <<std::endl;

                    marker.loc[i] = std::stod(iter->second);
                }
            }
            if (iter->second == std::string("REULER")) {
                // std::cout << "reading rot " <<std::endl;
                for (int i = 0; i < 3; i++) {
                    iter++;
                    // std::cout << "token is " << iter->first << ", " << iter->second <<std::endl;
                    double val = std::stod(iter->second);

                    if (iter->second.back() == 'D') {
                        // This is a decimal and we need to convert to radians
                        val *= CH_C_DEG_TO_RAD;
                    }
                    // std::cout << "val is " << val <<std::endl;
                    marker.rot[i] = val;
                }
            }
        }

        iter++;
    }
}